

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_defineProperties(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  int64_t iVar2;
  JSRefCountHeader *p;
  JSValueUnion JVar3;
  JSValue JVar4;
  
  JVar3 = (JSValueUnion)(argv->u).ptr;
  iVar2 = argv->tag;
  iVar1 = JS_ObjectDefineProperties(ctx,*argv,argv[1]);
  if (iVar1 == 0) {
    if (0xfffffff4 < (uint)iVar2) {
      *(int *)JVar3.ptr = *JVar3.ptr + 1;
    }
  }
  else {
    iVar2 = 6;
    JVar3.float64 = 0.0;
  }
  JVar4.tag = iVar2;
  JVar4.u.float64 = JVar3.float64;
  return JVar4;
}

Assistant:

static JSValue js_object_defineProperties(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv)
{
    // defineProperties(obj, properties)
    JSValueConst obj = argv[0];

    if (JS_ObjectDefineProperties(ctx, obj, argv[1]))
        return JS_EXCEPTION;
    else
        return JS_DupValue(ctx, obj);
}